

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

void __thiscall SQVM::FindOuter(SQVM *this,SQObjectPtr *target,SQObjectPtr *stackindex)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQSharedState *ss;
  SQObjectValue SVar3;
  SQTable *pSVar4;
  SQObjectValue *pSVar5;
  SQObjectPtr local_40;
  
  pSVar5 = (SQObjectValue *)&this->_openouters;
  SVar3 = (SQObjectValue)this->_openouters;
  if (((SQOuter *)SVar3.pTable != (SQOuter *)0x0) &&
     (pSVar4 = ((SVar3.pTable)->super_SQDelegable)._delegate, stackindex <= pSVar4)) {
    do {
      local_40.super_SQObject._unVal = SVar3;
      if (pSVar4 == (SQTable *)stackindex) {
        local_40.super_SQObject._type = OT_OUTER;
        pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        pSVar4 = (target->super_SQObject)._unVal.pTable;
        (target->super_SQObject)._unVal.pTable = (SQTable *)local_40.super_SQObject._unVal;
        SVar2 = (target->super_SQObject)._type;
        (target->super_SQObject)._type = OT_OUTER;
        pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        goto LAB_0012e6bb;
      }
      SVar3 = (SQObjectValue)(local_40.super_SQObject._unVal.pOuter)->_next;
    } while (((SQOuter *)SVar3.pTable != (SQOuter *)0x0) &&
            (pSVar4 = ((SVar3.pTable)->super_SQDelegable)._delegate, stackindex <= pSVar4));
    pSVar5 = (SQObjectValue *)&(local_40.super_SQObject._unVal.pOuter)->_next;
  }
  ss = this->_sharedstate;
  SVar3.pUserPointer = sq_vm_malloc(0x58);
  SQOuter::SQOuter(SVar3.pOuter,ss,stackindex);
  (SVar3.pTable)->_usednodes = (SQInteger)*(SQOuter **)pSVar5;
  (SVar3.pOuter)->_idx = (long)stackindex - (long)(this->_stack)._vals >> 4;
  pSVar1 = &((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  pSVar5->pOuter = (SQOuter *)SVar3;
  local_40.super_SQObject._type = OT_OUTER;
  pSVar1 = &((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  pSVar4 = (target->super_SQObject)._unVal.pTable;
  (target->super_SQObject)._unVal.pOuter = (SQOuter *)SVar3;
  SVar2 = (target->super_SQObject)._type;
  (target->super_SQObject)._type = OT_OUTER;
  pSVar1 = &((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_40.super_SQObject._unVal.pUserPointer = SVar3.pUserPointer;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
LAB_0012e6bb:
  SQObjectPtr::~SQObjectPtr(&local_40);
  return;
}

Assistant:

void SQVM::FindOuter(SQObjectPtr &target, SQObjectPtr *stackindex)
{
    SQOuter **pp = &_openouters;
    SQOuter *p;
    SQOuter *otr;

    while ((p = *pp) != NULL && p->_valptr >= stackindex) {
        if (p->_valptr == stackindex) {
            target = SQObjectPtr(p);
            return;
        }
        pp = &p->_next;
    }
    otr = SQOuter::Create(_ss(this), stackindex);
    otr->_next = *pp;
    otr->_idx  = (stackindex - _stack._vals);
    __ObjAddRef(otr);
    *pp = otr;
    target = SQObjectPtr(otr);
}